

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUtilitySourceCommand.cxx
# Opt level: O2

bool __thiscall
cmUtilitySourceCommand::InitialPass
          (cmUtilitySourceCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *name;
  cmMakefile *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  char *__s1;
  cmState *this_00;
  string *__rhs;
  ulong uVar6;
  allocator local_199;
  string utilitySource;
  string utilityExecutable;
  string utilityDirectory;
  string cmakeCFGout;
  string exePath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  name = (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)name;
  if (uVar6 < 0x41) {
    std::__cxx11::string::string
              ((string *)&utilitySource,"called with incorrect number of arguments",
               (allocator *)&cmakeCFGout);
    cmCommand::SetError(&this->super_cmCommand,&utilitySource);
    std::__cxx11::string::~string((string *)&utilitySource);
  }
  else {
    pcVar5 = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,name);
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string
              ((string *)&utilitySource,"CMAKE_CFG_INTDIR",(allocator *)&cmakeCFGout);
    __s1 = cmMakefile::GetRequiredDefinition(pcVar1,&utilitySource);
    std::__cxx11::string::~string((string *)&utilitySource);
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string
              ((string *)&utilitySource,"CMAKE_CROSSCOMPILING",(allocator *)&cmakeCFGout);
    bVar2 = cmMakefile::IsOn(pcVar1,&utilitySource);
    std::__cxx11::string::~string((string *)&utilitySource);
    if (bVar2) {
      if (pcVar5 != (char *)0x0) goto LAB_0039dd2b;
      std::__cxx11::string::string
                ((string *)&utilitySource,"UTILITY_SOURCE is used in cross compiling mode for ",
                 (allocator *)&cmakeCFGout);
      std::__cxx11::string::append((string *)&utilitySource);
      std::__cxx11::string::append((char *)&utilitySource);
      cmSystemTools::Message(utilitySource._M_dataplus._M_p,"Warning");
      std::__cxx11::string::~string((string *)&utilitySource);
    }
    else {
      this_00 = cmMakefile::GetState((this->super_cmCommand).Makefile);
      if (((pcVar5 != (char *)0x0) &&
          (((pcVar5 = strstr(pcVar5,"(IntDir)"), pcVar5 == (char *)0x0 ||
            ((__s1 != (char *)0x0 && (iVar3 = strcmp(__s1,"$(IntDir)"), iVar3 == 0)))) &&
           (uVar4 = cmState::GetCacheMajorVersion(this_00), uVar4 != 0)))) &&
         (uVar4 = cmState::GetCacheMinorVersion(this_00), uVar4 != 0)) goto LAB_0039dd2b;
    }
    pcVar5 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    std::__cxx11::string::string((string *)&utilitySource,pcVar5,(allocator *)&cmakeCFGout);
    std::operator+(&utilityDirectory,&utilitySource,"/");
    std::operator+(&cmakeCFGout,&utilityDirectory,name + 2);
    std::__cxx11::string::operator=((string *)&utilitySource,(string *)&cmakeCFGout);
    std::__cxx11::string::~string((string *)&cmakeCFGout);
    std::__cxx11::string::~string((string *)&utilityDirectory);
    bVar2 = cmsys::SystemTools::FileExists(utilitySource._M_dataplus._M_p);
    if (bVar2) {
      __rhs = name + 3;
      do {
        if (__rhs == (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish) {
          pcVar1 = (this->super_cmCommand).Makefile;
          std::__cxx11::string::string
                    ((string *)&utilityDirectory,"CMAKE_CFG_INTDIR",(allocator *)&exePath);
          pcVar5 = cmMakefile::GetRequiredDefinition(pcVar1,&utilityDirectory);
          std::__cxx11::string::string
                    ((string *)&cmakeCFGout,pcVar5,(allocator *)&utilityExecutable);
          std::__cxx11::string::~string((string *)&utilityDirectory);
          pcVar5 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommand).Makefile);
          std::__cxx11::string::string((string *)&utilityDirectory,pcVar5,(allocator *)&exePath);
          exePath._M_dataplus._M_p = (pointer)&exePath.field_2;
          exePath._M_string_length = 0;
          exePath.field_2._M_local_buf[0] = '\0';
          pcVar1 = (this->super_cmCommand).Makefile;
          std::__cxx11::string::string
                    ((string *)&utilityExecutable,"EXECUTABLE_OUTPUT_PATH",(allocator *)&local_d0);
          pcVar5 = cmMakefile::GetDefinition(pcVar1,&utilityExecutable);
          std::__cxx11::string::~string((string *)&utilityExecutable);
          if (pcVar5 != (char *)0x0) {
            pcVar1 = (this->super_cmCommand).Makefile;
            std::__cxx11::string::string
                      ((string *)&utilityExecutable,"EXECUTABLE_OUTPUT_PATH",(allocator *)&local_d0)
            ;
            cmMakefile::GetDefinition(pcVar1,&utilityExecutable);
            std::__cxx11::string::assign((char *)&exePath);
            std::__cxx11::string::~string((string *)&utilityExecutable);
          }
          if (exePath._M_string_length == 0) {
            std::operator+(&utilityExecutable,"/",name + 2);
            std::__cxx11::string::append((string *)&utilityDirectory);
            std::__cxx11::string::~string((string *)&utilityExecutable);
          }
          else {
            std::__cxx11::string::_M_assign((string *)&utilityDirectory);
          }
          std::operator+(&local_90,&utilityDirectory,"/");
          std::operator+(&local_70,&local_90,&cmakeCFGout);
          std::operator+(&local_50,&local_70,"/");
          std::operator+(&local_d0,&local_50,name + 1);
          pcVar1 = (this->super_cmCommand).Makefile;
          std::__cxx11::string::string((string *)&local_b0,"CMAKE_EXECUTABLE_SUFFIX",&local_199);
          pcVar5 = cmMakefile::GetDefinition(pcVar1,&local_b0);
          std::operator+(&utilityExecutable,&local_d0,pcVar5);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_90);
          cmsys::SystemTools::ReplaceString(&utilityExecutable,"/./","/");
          cmMakefile::AddCacheDefinition
                    ((this->super_cmCommand).Makefile,name,utilityExecutable._M_dataplus._M_p,
                     "Path to an internal program.",FILEPATH,false);
          cmsys::SystemTools::ConvertToUnixSlashes(&utilityExecutable);
          cmMakefile::AddCacheDefinition
                    ((this->super_cmCommand).Makefile,&utilityExecutable,name[1]._M_dataplus._M_p,
                     "Executable to project name.",INTERNAL,false);
          std::__cxx11::string::~string((string *)&utilityExecutable);
          std::__cxx11::string::~string((string *)&exePath);
          std::__cxx11::string::~string((string *)&utilityDirectory);
          std::__cxx11::string::~string((string *)&cmakeCFGout);
          break;
        }
        std::operator+(&utilityDirectory,&utilitySource,"/");
        std::operator+(&cmakeCFGout,&utilityDirectory,__rhs);
        std::__cxx11::string::~string((string *)&utilityDirectory);
        bVar2 = cmsys::SystemTools::FileExists(cmakeCFGout._M_dataplus._M_p);
        __rhs = __rhs + 1;
        std::__cxx11::string::~string((string *)&cmakeCFGout);
      } while (bVar2);
    }
    std::__cxx11::string::~string((string *)&utilitySource);
  }
LAB_0039dd2b:
  return 0x40 < uVar6;
}

Assistant:

bool cmUtilitySourceCommand::InitialPass(std::vector<std::string> const& args,
                                         cmExecutionStatus&)
{
  if (args.size() < 3) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  std::vector<std::string>::const_iterator arg = args.begin();

  // The first argument is the cache entry name.
  std::string const& cacheEntry = *arg++;
  const char* cacheValue = this->Makefile->GetDefinition(cacheEntry);
  // If it exists already and appears up to date then we are done.  If
  // the string contains "(IntDir)" but that is not the
  // CMAKE_CFG_INTDIR setting then the value is out of date.
  const char* intDir =
    this->Makefile->GetRequiredDefinition("CMAKE_CFG_INTDIR");

  bool haveCacheValue = false;
  if (this->Makefile->IsOn("CMAKE_CROSSCOMPILING")) {
    haveCacheValue = (cacheValue != CM_NULLPTR);
    if (!haveCacheValue) {
      std::string msg = "UTILITY_SOURCE is used in cross compiling mode for ";
      msg += cacheEntry;
      msg += ". If your intention is to run this executable, you need to "
             "preload the cache with the full path to a version of that "
             "program, which runs on this build machine.";
      cmSystemTools::Message(msg.c_str(), "Warning");
    }
  } else {
    cmState* state = this->Makefile->GetState();
    haveCacheValue =
      (cacheValue && (strstr(cacheValue, "(IntDir)") == CM_NULLPTR ||
                      (intDir && strcmp(intDir, "$(IntDir)") == 0)) &&
       (state->GetCacheMajorVersion() != 0 &&
        state->GetCacheMinorVersion() != 0));
  }

  if (haveCacheValue) {
    return true;
  }

  // The second argument is the utility's executable name, which will be
  // needed later.
  std::string const& utilityName = *arg++;

  // The third argument specifies the relative directory of the source
  // of the utility.
  std::string const& relativeSource = *arg++;
  std::string utilitySource = this->Makefile->GetCurrentSourceDirectory();
  utilitySource = utilitySource + "/" + relativeSource;

  // If the directory doesn't exist, the source has not been included.
  if (!cmSystemTools::FileExists(utilitySource.c_str())) {
    return true;
  }

  // Make sure all the files exist in the source directory.
  while (arg != args.end()) {
    std::string file = utilitySource + "/" + *arg++;
    if (!cmSystemTools::FileExists(file.c_str())) {
      return true;
    }
  }

  // The source exists.
  std::string cmakeCFGout =
    this->Makefile->GetRequiredDefinition("CMAKE_CFG_INTDIR");
  std::string utilityDirectory = this->Makefile->GetCurrentBinaryDirectory();
  std::string exePath;
  if (this->Makefile->GetDefinition("EXECUTABLE_OUTPUT_PATH")) {
    exePath = this->Makefile->GetDefinition("EXECUTABLE_OUTPUT_PATH");
  }
  if (!exePath.empty()) {
    utilityDirectory = exePath;
  } else {
    utilityDirectory += "/" + relativeSource;
  }

  // Construct the cache entry for the executable's location.
  std::string utilityExecutable = utilityDirectory + "/" + cmakeCFGout + "/" +
    utilityName + this->Makefile->GetDefinition("CMAKE_EXECUTABLE_SUFFIX");

  // make sure we remove any /./ in the name
  cmSystemTools::ReplaceString(utilityExecutable, "/./", "/");

  // Enter the value into the cache.
  this->Makefile->AddCacheDefinition(cacheEntry, utilityExecutable.c_str(),
                                     "Path to an internal program.",
                                     cmStateEnums::FILEPATH);
  // add a value into the cache that maps from the
  // full path to the name of the project
  cmSystemTools::ConvertToUnixSlashes(utilityExecutable);
  this->Makefile->AddCacheDefinition(utilityExecutable, utilityName.c_str(),
                                     "Executable to project name.",
                                     cmStateEnums::INTERNAL);

  return true;
}